

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playmidi.cpp
# Opt level: O1

void __thiscall Timidity::Renderer::kill_key_group(Renderer *this,int i)

{
  byte bVar1;
  int iVar2;
  Voice *pVVar3;
  long lVar4;
  Voice *pVVar5;
  Voice *pVVar6;
  long lVar7;
  
  pVVar3 = this->voice;
  if ((pVVar3[i].sample)->key_group != 0) {
    iVar2 = this->voices;
    lVar4 = (long)iVar2;
    if (lVar4 != 0) {
      lVar7 = 0;
      pVVar6 = pVVar3 + lVar4;
      do {
        pVVar5 = pVVar6 + -1;
        bVar1 = pVVar5->status;
        if (((((bVar1 & 0xd) != 1) && (~i + iVar2 != (int)lVar7)) &&
            (pVVar3[i].channel == pVVar6[-1].channel)) &&
           ((bVar1 & 1) != 0 && (pVVar6[-1].sample)->key_group == (pVVar3[i].sample)->key_group)) {
          pVVar5->status = bVar1 & 0xf1 | 0xc;
        }
        lVar7 = lVar7 + 1;
        pVVar6 = pVVar5;
      } while (lVar4 != lVar7);
    }
  }
  return;
}

Assistant:

void Renderer::kill_key_group(int i)
{
	int j = voices; 

	if (voice[i].sample->key_group == 0)
	{
		return;
	}
	while (j--)
	{
		if ((voice[j].status & VOICE_RUNNING) && !(voice[j].status & (VOICE_RELEASING | VOICE_STOPPING))) continue;
		if (i == j) continue;
		if (voice[i].channel != voice[j].channel) continue;
		if (voice[j].sample->key_group != voice[i].sample->key_group) continue;
		kill_note(j);
	}
}